

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  string *prop;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *range;
  uint uVar1;
  cmQtAutoGenGlobalInitializer *pcVar2;
  pointer pAVar3;
  _Hash_node_base *p_Var4;
  pointer pbVar5;
  pointer puVar6;
  pointer ppMVar7;
  pointer ppcVar8;
  cmMakefile *pcVar9;
  pointer pQVar10;
  pointer pQVar11;
  string_view suffix;
  bool bVar12;
  __type _Var13;
  cmake *pcVar14;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *pvVar15;
  string *psVar16;
  string *psVar17;
  __node_base *p_Var18;
  undefined7 extraout_var;
  string *psVar19;
  char *pcVar20;
  string *psVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  __uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  _Var23;
  byte bVar24;
  undefined8 extraout_RDX;
  ulong uVar26;
  ulong extraout_RDX_00;
  string *extraout_RDX_01;
  byte bVar25;
  string *extraout_RDX_02;
  undefined8 extraout_RDX_03;
  pointer args;
  long lVar28;
  pointer pQVar29;
  bool bVar30;
  undefined1 uVar31;
  _Alloc_hider in_R8;
  iterator __end4;
  pointer puVar32;
  pointer pQVar33;
  Qrc *qrc_1;
  pointer pAVar34;
  iterator __begin3;
  pointer ppMVar35;
  pointer ppcVar36;
  string_view arg;
  string_view ext;
  string_view ext_00;
  string_view ext_01;
  string_view ext_02;
  string_view arg_00;
  string_view arg_01;
  string_view extension;
  string_view filename;
  string_view extension_00;
  string_view extension_01;
  string_view text;
  string_view text_00;
  string_view prefix;
  string_view prefix_00;
  string_view suffix_00;
  string fullPath;
  string suffixedPath;
  MUFileHandle eMuf;
  char *pcStack_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  __node_base_ptr *local_350;
  size_type local_348;
  __node_base local_340;
  size_type sStack_338;
  float local_330;
  size_t local_328;
  __node_base_ptr p_Stack_320;
  string basePath;
  string uiHeaderRelativePath;
  string uicOpts;
  anon_class_8_1_8991fb9c addMUHeader;
  anon_class_8_1_8991fb9c addMUSource;
  anon_class_16_2_e88080e7 makeMUFile;
  string uiHeaderGenex;
  string local_208;
  Qrc qrc;
  string uiHeaderFilePath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  undefined8 uVar27;
  
  pcVar14 = cmMakefile::GetCMakeInstance(this->Makefile);
  pcVar2 = this->GlobalInitializer;
  makeMUFile.kw = &pcVar2->Keywords_;
  addMUHeader.this = this;
  addMUSource.this = this;
  makeMUFile.this = this;
  pvVar15 = cmGeneratorTarget::GetAllConfigSources(this->GenTarget);
  pAVar3 = (pvVar15->
           super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  psVar21 = &(pcVar2->Keywords_).SKIP_AUTOGEN;
  prop = &(pcVar2->Keywords_).AUTORCC_OPTIONS;
  for (pAVar34 = (pvVar15->
                 super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                 )._M_impl.super__Vector_impl_data._M_start; pAVar34 != pAVar3;
      pAVar34 = pAVar34 + 1) {
    psVar16 = cmSourceFile::GetFullPath_abi_cxx11_(pAVar34->Source);
    psVar17 = cmSourceFile::GetExtension_abi_cxx11_(pAVar34->Source);
    cmsys::SystemTools::LowerCase((string *)&eMuf,psVar17);
    if (((this->Moc).super_GenVarsT.Enabled != false) ||
       (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
      ext._M_str = (char *)eMuf._M_t.
                           super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                           .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                           _M_head_impl;
      ext._M_len = (size_t)pcStack_368;
      bVar12 = cmake::FileExtensions::Test(&pcVar14->HeaderFileExtensions,ext);
      if (bVar12) {
        in_R8._M_p = (pointer)&pAVar34->Configs;
        InitScanFiles::anon_class_16_2_e88080e7::operator()
                  ((anon_class_16_2_e88080e7 *)&qrc,(cmSourceFile *)&makeMUFile,
                   (string *)pAVar34->Source,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar16,
                   SUB81(in_R8._M_p,0));
        extension._M_str =
             (char *)eMuf._M_t.
                     super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                     .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl;
        extension._M_len = (size_t)pcStack_368;
        InitScanFiles::anon_class_8_1_8991fb9c::operator()
                  (&addMUHeader,(MUFileHandle *)&qrc,extension);
      }
      else {
        ext_00._M_str =
             (char *)eMuf._M_t.
                     super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                     .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl;
        ext_00._M_len = (size_t)pcStack_368;
        bVar12 = cmake::FileExtensions::Test(&pcVar14->CLikeSourceFileExtensions,ext_00);
        if (!bVar12) goto LAB_0026308e;
        in_R8._M_p = (pointer)&pAVar34->Configs;
        InitScanFiles::anon_class_16_2_e88080e7::operator()
                  ((anon_class_16_2_e88080e7 *)&qrc,(cmSourceFile *)&makeMUFile,
                   (string *)pAVar34->Source,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar16,
                   SUB81(in_R8._M_p,0));
        InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUSource,(MUFileHandle *)&qrc);
      }
      std::
      unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                     *)&qrc);
    }
LAB_0026308e:
    if (((((this->Rcc).super_GenVarsT.Enabled == true) &&
         (_Var13 = std::operator==((string *)&eMuf,&(pcVar2->Keywords_).qrc), _Var13)) &&
        (bVar12 = cmSourceFile::GetPropertyAsBool(pAVar34->Source,psVar21), !bVar12)) &&
       (bVar12 = cmSourceFile::GetPropertyAsBool(pAVar34->Source,&(pcVar2->Keywords_).SKIP_AUTORCC),
       !bVar12)) {
      Qrc::Qrc(&qrc);
      std::__cxx11::string::_M_assign((string *)&qrc.QrcFile);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&basePath,&qrc.QrcFile);
      std::__cxx11::string::operator=((string *)&qrc.QrcName,(string *)&basePath);
      std::__cxx11::string::~string((string *)&basePath);
      qrc.Generated = cmSourceFile::GetIsGenerated(pAVar34->Source,GlobalAndLocal);
      psVar16 = cmSourceFile::GetSafeProperty(pAVar34->Source,prop);
      if (psVar16->_M_string_length != 0) {
        arg._M_str = (psVar16->_M_dataplus)._M_p;
        arg._M_len = psVar16->_M_string_length;
        cmExpandList(arg,&qrc.Options,false);
      }
      std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
      emplace_back<cmQtAutoGenInitializer::Qrc>(&(this->Rcc).Qrcs,&qrc);
      Qrc::~Qrc(&qrc);
    }
    std::__cxx11::string::~string((string *)&eMuf);
  }
  cmGeneratorTarget::ClearSourcesCache(this->GenTarget);
  bVar25 = (this->Moc).super_GenVarsT.Enabled;
  bVar12 = (this->Uic).super_GenVarsT.Enabled;
  uVar26 = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar12);
  if (((bVar25 | bVar12) & 1) != 0) {
    p_Var18 = &(this->AutogenTarget).Sources._M_h._M_before_begin;
    range = &(this->AutogenTarget).Headers;
    pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)range;
    while( true ) {
      p_Var18 = p_Var18->_M_nxt;
      if (p_Var18 == (__node_base *)0x0) break;
      p_Var4 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var18 + 2))->_M_max_load_factor;
      if ((*(char *)((long)&p_Var4[8]._M_nxt + 3) != '\0') ||
         (*(char *)((long)&p_Var4[8]._M_nxt + 4) == '\x01')) {
        psVar16 = cmSourceFile::ResolveFullPath
                            ((cmSourceFile *)p_Var4[4]._M_nxt,(string *)0x0,(string *)0x0);
        filename._M_str = (char *)pbVar22;
        filename._M_len = (size_t)(psVar16->_M_dataplus)._M_p;
        cmQtAutoGen::SubDirPrefix_abi_cxx11_
                  (&suffixedPath,(cmQtAutoGen *)psVar16->_M_string_length,filename);
        qrc.LockFile._M_dataplus._M_p = (pointer)suffixedPath._M_string_length;
        qrc.LockFile._M_string_length = (size_type)suffixedPath._M_dataplus._M_p;
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&fullPath,psVar16);
        eMuf._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
              )(__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                )fullPath._M_string_length;
        pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  fullPath._M_string_length;
        cmStrCat<>(&basePath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf);
        std::__cxx11::string::~string((string *)&fullPath);
        std::__cxx11::string::~string((string *)&suffixedPath);
        for (lVar28 = 0; lVar28 != 0x20; lVar28 = lVar28 + 0x10) {
          qrc.LockFile._M_dataplus._M_p = (pointer)basePath._M_string_length;
          qrc.LockFile._M_string_length = (size_type)basePath._M_dataplus._M_p;
          eMuf._M_t.
          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
               *(__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                 *)&((__uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                      *)(InitScanFiles()::suffixes + lVar28))->_M_t;
          pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    basePath._M_string_length;
          cmStrCat<>(&suffixedPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf);
          pbVar5 = (pcVar14->HeaderFileExtensions).ordered.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (args = (pcVar14->HeaderFileExtensions).ordered.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; args != pbVar5; args = args + 1) {
            qrc.LockFile._M_dataplus._M_p = (pointer)suffixedPath._M_string_length;
            qrc.LockFile._M_string_length = (size_type)suffixedPath._M_dataplus._M_p;
            eMuf._M_t.
            super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                  )(__uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                    )0x1;
            local_360._M_local_buf[0] = '.';
            pbVar22 = args;
            cmStrCat<std::__cxx11::string>(&fullPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf,args);
            qrc.LockFile._M_dataplus._M_p =
                 (pointer)cmMakefile::GetSource(this->Makefile,&fullPath,Known);
            if ((cmSourceFile *)qrc.LockFile._M_dataplus._M_p == (cmSourceFile *)0x0) {
              bVar12 = cmsys::SystemTools::FileExists(&fullPath);
              if (bVar12) {
                pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &DAT_00000001;
                qrc.LockFile._M_dataplus._M_p =
                     (pointer)cmMakefile::CreateSource(this->Makefile,&fullPath,false,Known);
              }
LAB_002633da:
              if (qrc.LockFile._M_dataplus._M_p != (pointer)0x0) {
LAB_002633df:
                in_R8._M_p = (pointer)(p_Var4 + 5);
                InitScanFiles::anon_class_16_2_e88080e7::operator()
                          ((anon_class_16_2_e88080e7 *)&eMuf,(cmSourceFile *)&makeMUFile,
                           (string *)qrc.LockFile._M_dataplus._M_p,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&fullPath,
                           SUB81((Qrc *)(p_Var4 + 5),0));
                if (*(char *)((long)&p_Var4[8]._M_nxt + 3) == '\0') {
                  *(undefined1 *)
                   ((long)eMuf._M_t.
                          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                          _M_head_impl + 0x43) = 0;
                }
                if (*(char *)((long)&p_Var4[8]._M_nxt + 4) == '\0') {
                  *(undefined1 *)
                   ((long)eMuf._M_t.
                          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                          _M_head_impl + 0x44) = 0;
                }
                pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (args->_M_dataplus)._M_p;
                extension_00._M_str = (char *)pbVar22;
                extension_00._M_len = args->_M_string_length;
                InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUHeader,&eMuf,extension_00);
                std::
                unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                               *)&eMuf);
              }
            }
            else {
              bVar12 = ::cm::
                       contains<std::unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>,_cmSourceFile_*,_0>
                                 (range,(cmSourceFile **)&qrc);
              if (!bVar12) {
                bVar12 = cmSourceFile::GetIsGenerated
                                   ((cmSourceFile *)qrc.LockFile._M_dataplus._M_p,GlobalAndLocal);
                if (bVar12) goto LAB_002633da;
                bVar12 = cmsys::SystemTools::FileExists(&fullPath);
                pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (CONCAT71(extraout_var,bVar12) & 0xffffffff);
                if (((byte)pbVar22 & qrc.LockFile._M_dataplus._M_p != (pointer)0x0) == 0)
                goto LAB_0026343c;
                goto LAB_002633df;
              }
            }
LAB_0026343c:
            std::__cxx11::string::~string((string *)&fullPath);
          }
          std::__cxx11::string::~string((string *)&suffixedPath);
        }
        std::__cxx11::string::~string((string *)&basePath);
        uVar26 = extraout_RDX_00;
      }
    }
    bVar25 = (this->Moc).super_GenVarsT.Enabled;
    uVar26 = CONCAT71((int7)(uVar26 >> 8),(this->Uic).super_GenVarsT.Enabled);
  }
  pcVar20 = (char *)(uVar26 & 0xffffffff);
  bVar24 = (byte)uVar26 | bVar25;
  psVar16 = (string *)CONCAT71((int7)(uVar26 >> 8),bVar24);
  if ((bVar24 & 1) != 0) {
    puVar6 = (this->Makefile->SourceFiles).
             super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar17 = &(pcVar2->Keywords_).SKIP_AUTOUIC;
    psVar16 = psVar17;
    for (puVar32 = (this->Makefile->SourceFiles).
                   super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar6;
        puVar32 = puVar32 + 1) {
      suffixedPath._M_dataplus._M_p = (pointer)&suffixedPath.field_2;
      suffixedPath._M_string_length = 0;
      suffixedPath.field_2._M_local_buf[0] = '\0';
      psVar16 = cmSourceFile::ResolveFullPath
                          ((puVar32->_M_t).
                           super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                           .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,&suffixedPath,
                           (string *)0x0);
      if ((suffixedPath._M_string_length == 0) && (psVar16->_M_string_length != 0)) {
        psVar19 = cmSourceFile::GetExtension_abi_cxx11_
                            ((puVar32->_M_t).
                             super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                             .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl);
        cmsys::SystemTools::LowerCase(&fullPath,psVar19);
        ext_01._M_str = fullPath._M_dataplus._M_p;
        ext_01._M_len = fullPath._M_string_length;
        bVar12 = cmake::FileExtensions::Test(&pcVar14->HeaderFileExtensions,ext_01);
        bVar30 = SUB81(&qrc,0);
        if (bVar12) {
          qrc.LockFile._M_dataplus._M_p =
               (pointer)(puVar32->_M_t).
                        super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t
                        .super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                        super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
          bVar12 = ::cm::
                   contains<std::unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>,_cmSourceFile_*,_0>
                             (&(this->AutogenTarget).Headers,(cmSourceFile **)&qrc);
          if (!bVar12) {
            qrc.LockFile._M_dataplus._M_p = (pointer)0x0;
            qrc.LockFile._M_string_length = 0;
            qrc.LockFile.field_2._M_allocated_capacity = 0;
            in_R8._M_p = (pointer)&qrc;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)&eMuf,(cmSourceFile *)&makeMUFile,
                       (string *)
                       (puVar32->_M_t).
                       super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
                       super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                       super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar16,bVar30);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&qrc);
            if ((*(char *)((long)eMuf._M_t.
                                 super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                 .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                                 _M_head_impl + 0x41) != '\0') ||
               (pcVar20 = (char *)psVar16,
               *(char *)((long)eMuf._M_t.
                               super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                               .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                               _M_head_impl + 0x42) == '\x01')) {
              extension_01._M_str = fullPath._M_dataplus._M_p;
              extension_01._M_len = fullPath._M_string_length;
              pcVar20 = (char *)fullPath._M_dataplus;
              InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUHeader,&eMuf,extension_01);
            }
LAB_0026370b:
            std::
            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                           *)&eMuf);
          }
        }
        else {
          ext_02._M_str = fullPath._M_dataplus._M_p;
          ext_02._M_len = fullPath._M_string_length;
          bVar12 = cmake::FileExtensions::Test(&pcVar14->CLikeSourceFileExtensions,ext_02);
          if (bVar12) {
            qrc.LockFile._M_dataplus._M_p =
                 (pointer)(puVar32->_M_t).
                          super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                          .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
            bVar12 = ::cm::
                     contains<std::unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>,_cmSourceFile_*,_0>
                               (&(this->AutogenTarget).Sources,(cmSourceFile **)&qrc);
            if (!bVar12) {
              qrc.LockFile._M_dataplus._M_p = (pointer)0x0;
              qrc.LockFile._M_string_length = 0;
              qrc.LockFile.field_2._M_allocated_capacity = 0;
              in_R8._M_p = (pointer)&qrc;
              InitScanFiles::anon_class_16_2_e88080e7::operator()
                        ((anon_class_16_2_e88080e7 *)&eMuf,(cmSourceFile *)&makeMUFile,
                         (string *)
                         (puVar32->_M_t).
                         super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                         super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar16,bVar30);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&qrc);
              if ((*(char *)((long)eMuf._M_t.
                                   super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                   .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                                   _M_head_impl + 0x41) != '\0') ||
                 (pcVar20 = (char *)psVar16,
                 *(char *)((long)eMuf._M_t.
                                 super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                 .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                                 _M_head_impl + 0x42) == '\x01')) {
                InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUSource,&eMuf);
                pcVar20 = (char *)psVar16;
              }
              goto LAB_0026370b;
            }
          }
          else if (((this->Uic).super_GenVarsT.Enabled == true) &&
                  (_Var13 = std::operator==(&fullPath,&(pcVar2->Keywords_).ui), _Var13)) {
            bVar12 = cmSourceFile::GetPropertyAsBool
                               ((puVar32->_M_t).
                                super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,psVar21);
            if ((bVar12) ||
               (bVar12 = cmSourceFile::GetPropertyAsBool
                                   ((puVar32->_M_t).
                                    super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                    .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                                    psVar17), bVar12)) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(this->Uic).SkipUi,psVar16);
            }
            else {
              psVar19 = cmSourceFile::GetSafeProperty
                                  ((puVar32->_M_t).
                                   super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                   .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                                   &(pcVar2->Keywords_).AUTOUIC_OPTIONS);
              std::__cxx11::string::string((string *)&uicOpts,(string *)psVar19);
              if (uicOpts._M_string_length == 0) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string_const&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &(this->Uic).UiFilesNoOptions,psVar16);
              }
              else {
                arg_00._M_str._1_7_ = uicOpts._M_dataplus._M_p._1_7_;
                arg_00._M_str._0_1_ = uicOpts._M_dataplus._M_p._0_1_;
                arg_00._M_len = uicOpts._M_string_length;
                cmExpandedList_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&qrc,arg_00,false);
                std::
                vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ::
                emplace_back<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                            *)&(this->Uic).UiFilesWithOptions,psVar16,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&qrc);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&qrc);
              }
              psVar19 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(this->LocalGen);
              cmsys::SystemTools::GetFilenamePath(&qrc.LockFile,psVar16);
              cmSystemTools::RelativePath(&uiHeaderRelativePath,psVar19,&qrc.LockFile);
              std::__cxx11::string::~string((string *)&qrc);
              if (uiHeaderRelativePath._M_string_length == 0) {
                _Var23._M_t.
                super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
                     (tuple<cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                      )(_Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                        )0x0;
              }
              else {
                _Var23._M_t.
                super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
                     (tuple<cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                      )(tuple<cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                        )uiHeaderRelativePath._M_string_length;
                if (uiHeaderRelativePath._M_dataplus._M_p[uiHeaderRelativePath._M_string_length - 1]
                    != '/') {
                  std::__cxx11::string::push_back((char)&uiHeaderRelativePath);
                  _Var23._M_t.
                  super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                  .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
                       (tuple<cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                        )(tuple<cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          )uiHeaderRelativePath._M_string_length;
                }
              }
              qrc.LockFile._M_dataplus._M_p = &DAT_00000001;
              qrc.LockFile._M_string_length = (size_type)&qrc.LockFile.field_2;
              qrc.LockFile.field_2._M_local_buf[0] = 0x2f;
              uiHeaderGenex._M_dataplus._M_p = (pointer)0x3;
              uiHeaderGenex._M_string_length = (size_type)anon_var_dwarf_89286b;
              eMuf._M_t.
              super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
                   (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                    )(__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                      )_Var23._M_t.
                       super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                       .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl;
              cmsys::SystemTools::GetFilenameWithoutLastExtension(&basePath,psVar16);
              local_208._M_dataplus._M_p = (pointer)0x2;
              local_208._M_string_length = 0x64f1bb;
              cmStrCat<cm::static_string_view,std::__cxx11::string,cm::static_string_view>
                        (&uiHeaderFilePath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf,
                         (static_string_view *)&uiHeaderGenex,&basePath,
                         (static_string_view *)&local_208);
              std::__cxx11::string::~string((string *)&basePath);
              eMuf._M_t.
              super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
                   (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                    )&local_360;
              local_360._M_local_buf[0] = '\0';
              local_350 = &p_Stack_320;
              local_348 = 1;
              local_340._M_nxt = (_Hash_node_base *)0x0;
              sStack_338 = 0;
              local_330 = 1.0;
              uiHeaderGenex._M_dataplus._M_p = (pointer)&uiHeaderGenex.field_2;
              uiHeaderGenex._M_string_length = 0;
              local_328 = 0;
              p_Stack_320 = (__node_base_ptr)0x0;
              uiHeaderGenex.field_2._M_local_buf[0] = '\0';
              qrc.LockFile._M_string_length = (size_type)(this->Dir).Build._M_dataplus._M_p;
              qrc.LockFile._M_dataplus._M_p = (pointer)(this->Dir).Build._M_string_length;
              basePath._M_dataplus._M_p = (pointer)0x8;
              basePath._M_string_length = (long)"/usr/include" + 4;
              cmStrCat<>(&local_208,(cmAlphaNum *)&qrc,(cmAlphaNum *)&basePath);
              suffix._M_str = uiHeaderFilePath._M_dataplus._M_p;
              suffix._M_len = uiHeaderFilePath._M_string_length;
              prefix_00._M_str = local_208._M_dataplus._M_p;
              prefix_00._M_len = local_208._M_string_length;
              in_R8._M_p = local_208._M_dataplus._M_p;
              pcVar20 = (char *)uiHeaderFilePath._M_dataplus;
              ConfigFileNamesAndGenex(this,(ConfigString *)&eMuf,&uiHeaderGenex,prefix_00,suffix);
              std::__cxx11::string::~string((string *)&local_208);
              std::
              pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<cmQtAutoGenInitializer::ConfigString_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        ((pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&qrc,(ConfigString *)&eMuf,&uiHeaderGenex);
              std::
              vector<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>,std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>>
              ::emplace_back<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>
                        ((vector<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>,std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>>
                          *)&(this->Uic).UiHeaders,
                         (pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&qrc);
              std::
              pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&qrc);
              std::__cxx11::string::~string((string *)&uiHeaderGenex);
              ConfigString::~ConfigString((ConfigString *)&eMuf);
              std::__cxx11::string::~string((string *)&uiHeaderFilePath);
              std::__cxx11::string::~string((string *)&uiHeaderRelativePath);
              std::__cxx11::string::~string((string *)&uicOpts);
            }
          }
        }
        std::__cxx11::string::~string((string *)&fullPath);
      }
      std::__cxx11::string::~string((string *)&suffixedPath);
      psVar16 = extraout_RDX_01;
    }
    bVar25 = (this->Moc).super_GenVarsT.Enabled;
    pcVar20 = (char *)CONCAT71((int7)((ulong)pcVar20 >> 8),(this->Uic).super_GenVarsT.Enabled);
  }
  if (((bVar25 & 1) != 0) || (((ulong)pcVar20 & 1) != 0)) {
    ppMVar35 = (this->AutogenTarget).FilesGenerated.
               super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppMVar7 = (this->AutogenTarget).FilesGenerated.
              super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar35 != ppMVar7) {
      if (this->CMP0071Accept == true) {
        for (; ppMVar35 != ppMVar7; ppMVar35 = ppMVar35 + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&(this->AutogenTarget).DependFiles,&(*ppMVar35)->FullPath);
        }
      }
      else if (this->CMP0071Warn == true) {
        uiHeaderRelativePath._M_dataplus._M_p = (pointer)0x0;
        uiHeaderRelativePath._M_string_length = 0;
        if ((bVar25 & 1) == 0) {
          if (((ulong)pcVar20 & 1) != 0) {
            pcVar20 = "SKIP_AUTOUIC";
            goto LAB_00263b81;
          }
        }
        else {
          if (((ulong)pcVar20 & 1) == 0) {
            pcVar20 = "SKIP_AUTOMOC";
          }
          else {
            pcVar20 = "SKIP_AUTOGEN";
          }
LAB_00263b81:
          uiHeaderRelativePath._M_dataplus._M_p = (pointer)0xc;
          uiHeaderRelativePath._M_string_length = (size_type)pcVar20;
        }
        basePath._M_dataplus._M_p = (pointer)&basePath.field_2;
        basePath._M_string_length = 0;
        basePath.field_2._M_local_buf[0] = '\0';
        for (; uVar31 = SUB81(in_R8._M_p,0), ppMVar35 != ppMVar7; ppMVar35 = ppMVar35 + 1) {
          qrc.LockFile._M_dataplus._M_p = (pointer)0x2;
          qrc.LockFile._M_string_length = (long)"Resource spec file:\n\n  " + 0x15;
          text._M_str = "  ";
          text._M_len = (size_t)((*ppMVar35)->FullPath)._M_dataplus._M_p;
          cmQtAutoGen::Quoted_abi_cxx11_
                    (&fullPath,(cmQtAutoGen *)((*ppMVar35)->FullPath)._M_string_length,text);
          eMuf._M_t.
          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                )(__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                  )fullPath._M_string_length;
          uicOpts._M_dataplus._M_p._0_1_ = 10;
          cmStrCat<char>(&suffixedPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf,(char *)&uicOpts);
          std::__cxx11::string::append((string *)&basePath);
          std::__cxx11::string::~string((string *)&suffixedPath);
          std::__cxx11::string::~string((string *)&fullPath);
          psVar16 = extraout_RDX_02;
        }
        pcVar9 = this->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&fullPath,(cmPolicies *)0x47,(PolicyID)psVar16);
        qrc.LockFile._M_dataplus._M_p = (pointer)fullPath._M_string_length;
        qrc.LockFile._M_string_length = (size_type)fullPath._M_dataplus._M_p;
        eMuf._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
              )(__uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                )0x1;
        local_360._M_local_buf[0] = '\n';
        cmQtAutoGen::Tools_abi_cxx11_
                  (&uicOpts,(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
                   (this->Uic).super_GenVarsT.Enabled,false,(bool)uVar31);
        pcVar20 = "For compatibility, CMake is excluding the GENERATED source file(s):\n";
        in_R8._M_p = (pointer)&basePath;
        cmStrCat<char[69],std::__cxx11::string,char[20],std::__cxx11::string,char[171],std::basic_string_view<char,std::char_traits<char>>,char[41],std::basic_string_view<char,std::char_traits<char>>,char[6]>
                  (&suffixedPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf,
                   (char (*) [69])
                   "For compatibility, CMake is excluding the GENERATED source file(s):\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8._M_p,
                   (char (*) [20])"from processing by ",&uicOpts,
                   (char (*) [171])
                   ".  If any of the files should be processed, set CMP0071 to NEW.  If any of the files should not be processed, explicitly exclude them by setting the source file property "
                   ,(basic_string_view<char,_std::char_traits<char>_> *)&uiHeaderRelativePath,
                   (char (*) [41])":\n  set_property(SOURCE file.h PROPERTY ",
                   (basic_string_view<char,_std::char_traits<char>_> *)&uiHeaderRelativePath,
                   (char (*) [6])" ON)\n");
        cmMakefile::IssueMessage(pcVar9,AUTHOR_WARNING,&suffixedPath);
        std::__cxx11::string::~string((string *)&suffixedPath);
        std::__cxx11::string::~string((string *)&uicOpts);
        std::__cxx11::string::~string((string *)&fullPath);
        std::__cxx11::string::~string((string *)&basePath);
      }
    }
  }
  bVar12 = (this->Moc).super_GenVarsT.Enabled;
  psVar21 = (string *)CONCAT71((int7)((ulong)pcVar20 >> 8),bVar12);
  bVar30 = (this->Uic).super_GenVarsT.Enabled;
  bVar25 = (byte)((ulong)psVar21 & 0xffffffff) | bVar30;
  uVar27 = CONCAT71((int7)(((ulong)psVar21 & 0xffffffff) >> 8),bVar25);
  if ((bVar25 & 1) == 0) goto LAB_00263f82;
  ppcVar36 = (this->AutogenTarget).CMP0100HeadersWarn.
             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar8 = (this->AutogenTarget).CMP0100HeadersWarn.
            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar36 == ppcVar8) goto LAB_00263f82;
  uiHeaderRelativePath._M_dataplus._M_p = (pointer)0x0;
  uiHeaderRelativePath._M_string_length = 0;
  if (bVar12 == false) {
    if ((bVar30 & 1U) != 0) {
      pcVar20 = "SKIP_AUTOUIC";
      goto LAB_00263dbb;
    }
  }
  else {
    if ((bVar30 & 1U) == 0) {
      pcVar20 = "SKIP_AUTOMOC";
    }
    else {
      pcVar20 = "SKIP_AUTOGEN";
    }
LAB_00263dbb:
    uiHeaderRelativePath._M_dataplus._M_p = (pointer)0xc;
    uiHeaderRelativePath._M_string_length = (size_type)pcVar20;
  }
  basePath._M_dataplus._M_p = (pointer)&basePath.field_2;
  basePath._M_string_length = 0;
  basePath.field_2._M_local_buf[0] = '\0';
  for (; uVar31 = SUB81(in_R8._M_p,0), ppcVar36 != ppcVar8; ppcVar36 = ppcVar36 + 1) {
    qrc.LockFile._M_dataplus._M_p = (pointer)0x2;
    qrc.LockFile._M_string_length = (long)"Resource spec file:\n\n  " + 0x15;
    psVar16 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar36);
    text_00._M_str = (char *)psVar21;
    text_00._M_len = (size_t)(psVar16->_M_dataplus)._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_(&fullPath,(cmQtAutoGen *)psVar16->_M_string_length,text_00);
    eMuf._M_t.
    super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
    .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
          )(__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
            )fullPath._M_string_length;
    uicOpts._M_dataplus._M_p._0_1_ = 10;
    psVar21 = &uicOpts;
    cmStrCat<char>(&suffixedPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf,(char *)&uicOpts);
    std::__cxx11::string::append((string *)&basePath);
    std::__cxx11::string::~string((string *)&suffixedPath);
    std::__cxx11::string::~string((string *)&fullPath);
    uVar27 = extraout_RDX_03;
  }
  pcVar9 = this->Makefile;
  cmPolicies::GetPolicyWarning_abi_cxx11_(&fullPath,(cmPolicies *)0x64,(PolicyID)uVar27);
  qrc.LockFile._M_dataplus._M_p = (pointer)fullPath._M_string_length;
  qrc.LockFile._M_string_length = (size_type)fullPath._M_dataplus._M_p;
  eMuf._M_t.
  super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
        )(__uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          )0x1;
  local_360._M_local_buf[0] = '\n';
  cmQtAutoGen::Tools_abi_cxx11_
            (&uicOpts,(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
             (this->Uic).super_GenVarsT.Enabled,false,(bool)uVar31);
  cmStrCat<char[59],std::__cxx11::string,char[20],std::__cxx11::string,char[171],std::basic_string_view<char,std::char_traits<char>>,char[42],std::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&suffixedPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf,
             (char (*) [59])"For compatibility, CMake is excluding the header file(s):\n",&basePath,
             (char (*) [20])"from processing by ",&uicOpts,
             (char (*) [171])
             ".  If any of the files should be processed, set CMP0100 to NEW.  If any of the files should not be processed, explicitly exclude them by setting the source file property "
             ,(basic_string_view<char,_std::char_traits<char>_> *)&uiHeaderRelativePath,
             (char (*) [42])":\n  set_property(SOURCE file.hh PROPERTY ",
             (basic_string_view<char,_std::char_traits<char>_> *)&uiHeaderRelativePath,
             (char (*) [6])" ON)\n");
  cmMakefile::IssueMessage(pcVar9,AUTHOR_WARNING,&suffixedPath);
  std::__cxx11::string::~string((string *)&suffixedPath);
  std::__cxx11::string::~string((string *)&uicOpts);
  std::__cxx11::string::~string((string *)&fullPath);
  std::__cxx11::string::~string((string *)&basePath);
LAB_00263f82:
  if ((this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = (this->QtVersion).Major;
    psVar21 = cmGeneratorTarget::GetSafeProperty(this->GenTarget,prop);
    arg_01._M_str = (psVar21->_M_dataplus)._M_p;
    arg_01._M_len = psVar21->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&fullPath,arg_01,false);
    pQVar10 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar29 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar29 != pQVar10;
        pQVar29 = pQVar29 + 1) {
      pQVar29->Unique = true;
      pQVar11 = (this->Rcc).Qrcs.
                super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pQVar33 = (this->Rcc).Qrcs.
                     super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                     ._M_impl.super__Vector_impl_data._M_start; pQVar33 != pQVar11;
          pQVar33 = pQVar33 + 1) {
        if ((pQVar33 != pQVar29) &&
           (_Var13 = std::operator==(&pQVar29->QrcName,&pQVar33->QrcName), _Var13)) {
          pQVar29->Unique = false;
          break;
        }
      }
    }
    pQVar10 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar29 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar29 != pQVar10;
        pQVar29 = pQVar29 + 1) {
      cmFilePathChecksum::getPart(&qrc.LockFile,&this->PathCheckSum,&pQVar29->QrcFile,10);
      std::__cxx11::string::operator=((string *)&pQVar29->QrcPathChecksum,(string *)&qrc);
      std::__cxx11::string::~string((string *)&qrc);
      qrc.LockFile._M_string_length = (size_type)(this->Dir).Build._M_dataplus._M_p;
      qrc.LockFile._M_dataplus._M_p = (pointer)(this->Dir).Build._M_string_length;
      eMuf._M_t.
      super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
            )(__uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              )0x1;
      local_360._M_local_buf[0] = '/';
      cmStrCat<std::__cxx11::string,char[6],std::__cxx11::string,char[5]>
                (&basePath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf,&pQVar29->QrcPathChecksum,
                 (char (*) [6])"/qrc_",&pQVar29->QrcName,(char (*) [5])0x67954a);
      std::__cxx11::string::operator=((string *)&pQVar29->OutputFile,(string *)&basePath);
      std::__cxx11::string::~string((string *)&basePath);
      qrc.LockFile._M_string_length = (size_type)(this->Dir).Info._M_dataplus._M_p;
      qrc.LockFile._M_dataplus._M_p = (pointer)(this->Dir).Info._M_string_length;
      eMuf._M_t.
      super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
            )(__uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              )0x9;
      suffixedPath._M_dataplus._M_p._0_1_ = 0x5f;
      cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
                (&basePath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf,&pQVar29->QrcName,
                 (char *)&suffixedPath,&pQVar29->QrcPathChecksum);
      qrc.LockFile._M_dataplus._M_p = (pointer)basePath._M_string_length;
      qrc.LockFile._M_string_length = (size_type)basePath._M_dataplus._M_p;
      eMuf._M_t.
      super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
            )(__uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              )0xa;
      cmStrCat<>(&suffixedPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf);
      std::__cxx11::string::operator=((string *)pQVar29,(string *)&suffixedPath);
      std::__cxx11::string::~string((string *)&suffixedPath);
      qrc.LockFile._M_dataplus._M_p = (pointer)basePath._M_string_length;
      qrc.LockFile._M_string_length = (size_type)basePath._M_dataplus._M_p;
      eMuf._M_t.
      super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
            )(__uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              )0xa;
      cmStrCat<>(&suffixedPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf);
      std::__cxx11::string::operator=((string *)&pQVar29->InfoFile,(string *)&suffixedPath);
      std::__cxx11::string::~string((string *)&suffixedPath);
      qrc.LockFile._M_dataplus._M_p = (pointer)basePath._M_string_length;
      qrc.LockFile._M_string_length = (size_type)basePath._M_dataplus._M_p;
      eMuf._M_t.
      super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
            )(__uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              )0x5;
      cmStrCat<>(&suffixedPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf);
      prefix._M_str = suffixedPath._M_dataplus._M_p;
      prefix._M_len = suffixedPath._M_string_length;
      suffix_00._M_str = ".txt";
      suffix_00._M_len = 4;
      ConfigFileNames(this,&pQVar29->SettingsFile,prefix,suffix_00);
      std::__cxx11::string::~string((string *)&suffixedPath);
      std::__cxx11::string::~string((string *)&basePath);
    }
    pQVar10 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar29 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar29 != pQVar10;
        pQVar29 = pQVar29 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&uicOpts,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&fullPath);
      std::__cxx11::string::string((string *)&basePath,(string *)&pQVar29->QrcName);
      qrc.LockFile._M_dataplus._M_p._0_1_ = 0x2d;
      eMuf._M_t.
      super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
      .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl._0_1_ = 0x5f;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )basePath._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(basePath._M_dataplus._M_p + basePath._M_string_length),(char *)&qrc,
                 (char *)&eMuf);
      if (pQVar29->Unique == false) {
        qrc.LockFile._M_dataplus._M_p = &DAT_00000001;
        qrc.LockFile._M_string_length = (size_type)&qrc.LockFile.field_2;
        qrc.LockFile.field_2._M_local_buf[0] = 0x5f;
        eMuf._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
              )(pQVar29->QrcPathChecksum)._M_string_length;
        cmStrCat<>(&suffixedPath,(cmAlphaNum *)&qrc,(cmAlphaNum *)&eMuf);
        std::__cxx11::string::append((string *)&basePath);
        std::__cxx11::string::~string((string *)&suffixedPath);
      }
      qrc.LockFile._M_dataplus._M_p = (pointer)0x0;
      qrc.LockFile._M_string_length = 0;
      qrc.LockFile.field_2._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[6]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&qrc,
                 (char (*) [6])0x67d6c7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&qrc,&basePath
                );
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&uicOpts,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&qrc,4 < uVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qrc);
      std::__cxx11::string::~string((string *)&basePath);
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&uicOpts,&pQVar29->Options,4 < uVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&pQVar29->Options,&uicOpts);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&uicOpts);
    }
    pQVar10 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar29 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar29 != pQVar10;
        pQVar29 = pQVar29 + 1) {
      if (pQVar29->Generated == false) {
        eMuf._M_t.
        super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
              )&local_360;
        local_360._M_local_buf[0] = '\0';
        std::__cxx11::string::string
                  ((string *)&local_50,(string *)&(this->Rcc).super_GenVarsT.Executable);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_68,
                 &((this->Rcc).super_GenVarsT.ExecutableFeatures.
                   super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->ListOptions);
        cmQtAutoGen::RccLister::RccLister((RccLister *)&qrc,&local_50,&local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        std::__cxx11::string::~string((string *)&local_50);
        bVar12 = cmQtAutoGen::RccLister::list
                           ((RccLister *)&qrc,&pQVar29->QrcFile,&pQVar29->Resources,(string *)&eMuf,
                            false);
        if (!bVar12) {
          cmSystemTools::Error((string *)&eMuf);
          cmQtAutoGen::RccLister::~RccLister((RccLister *)&qrc);
          std::__cxx11::string::~string((string *)&eMuf);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fullPath);
          return false;
        }
        cmQtAutoGen::RccLister::~RccLister((RccLister *)&qrc);
        std::__cxx11::string::~string((string *)&eMuf);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fullPath);
  }
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmake const* cm = this->Makefile->GetCMakeInstance();
  auto const& kw = this->GlobalInitializer->kw();

  auto makeMUFile = [this, &kw](cmSourceFile* sf, std::string const& fullPath,
                                std::vector<size_t> const& configs,
                                bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->FullPath = fullPath;
    muf->SF = sf;
    if (!configs.empty() && configs.size() != this->ConfigsList.size()) {
      muf->Configs = configs;
    }
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOMOC));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUHeader = [this](MUFileHandle&& muf, cm::string_view extension) {
    cmSourceFile* sf = muf->SF;
    const bool muIt = (muf->MocIt || muf->UicIt);
    if (this->CMP0100Accept || (extension != "hh")) {
      // Accept
      if (muIt && muf->Generated) {
        this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
      }
      this->AutogenTarget.Headers.emplace(sf, std::move(muf));
    } else if (muIt && this->CMP0100Warn) {
      // Store file for warning message
      this->AutogenTarget.CMP0100HeadersWarn.push_back(sf);
    }
  };

  auto addMUSource = [this](MUFileHandle&& muf) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
  };

  // Scan through target files
  {
    // Scan through target files
    for (cmGeneratorTarget::AllConfigSource const& acs :
         this->GenTarget->GetAllConfigSources()) {
      std::string const& fullPath = acs.Source->GetFullPath();
      std::string const& extLower =
        cmSystemTools::LowerCase(acs.Source->GetExtension());

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        if (cm->IsAHeaderExtension(extLower)) {
          addMUHeader(makeMUFile(acs.Source, fullPath, acs.Configs, true),
                      extLower);
        } else if (cm->IsACLikeSourceExtension(extLower)) {
          addMUSource(makeMUFile(acs.Source, fullPath, acs.Configs, true));
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((extLower == kw.qrc) &&
            !acs.Source->GetPropertyAsBool(kw.SKIP_AUTOGEN) &&
            !acs.Source->GetPropertyAsBool(kw.SKIP_AUTORCC)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = fullPath;
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = acs.Source->GetIsGenerated();
          // RCC options
          {
            std::string const& opts =
              acs.Source->GetSafeProperty(kw.AUTORCC_OPTIONS);
            if (!opts.empty()) {
              cmExpandList(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetAllConfigSources computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->GenTarget->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    // Header search suffixes and extensions
    static std::initializer_list<cm::string_view> const suffixes{ "", "_p" };
    auto const& exts = cm->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& srcFullPath = muf.SF->ResolveFullPath();
        std::string basePath = cmStrCat(
          cmQtAutoGen::SubDirPrefix(srcFullPath),
          cmSystemTools::GetFilenameWithoutLastExtension(srcFullPath));
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = cmStrCat(basePath, suffix);
          for (auto const& ext : exts) {
            std::string fullPath = cmStrCat(suffixedPath, '.', ext);

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf =
              this->Makefile->GetSource(fullPath, locationKind);
            if (sf) {
              // Check if we know about this header already
              if (cm::contains(this->AutogenTarget.Headers, sf)) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = this->Makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf) {
              auto eMuf = makeMUFile(sf, fullPath, muf.Configs, true);
              // Only process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              addMUHeader(std::move(eMuf), ext);
            }
          }
        }
      }
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (const auto& sf : this->Makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->ResolveFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->ResolveFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& extLower =
        cmSystemTools::LowerCase(sf->GetExtension());

      if (cm->IsAHeaderExtension(extLower)) {
        if (!cm::contains(this->AutogenTarget.Headers, sf.get())) {
          auto muf = makeMUFile(sf.get(), fullPath, {}, false);
          if (muf->SkipMoc || muf->SkipUic) {
            addMUHeader(std::move(muf), extLower);
          }
        }
      } else if (cm->IsACLikeSourceExtension(extLower)) {
        if (!cm::contains(this->AutogenTarget.Sources, sf.get())) {
          auto muf = makeMUFile(sf.get(), fullPath, {}, false);
          if (muf->SkipMoc || muf->SkipUic) {
            addMUSource(std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (extLower == kw.ui)) {
        // .ui file
        bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(kw.AUTOUIC_OPTIONS);
          if (uicOpts.empty()) {
            this->Uic.UiFilesNoOptions.emplace_back(fullPath);
          } else {
            this->Uic.UiFilesWithOptions.emplace_back(fullPath,
                                                      cmExpandedList(uicOpts));
          }

          auto uiHeaderRelativePath = cmSystemTools::RelativePath(
            this->LocalGen->GetCurrentSourceDirectory(),
            cmSystemTools::GetFilenamePath(fullPath));

          // Avoid creating a path containing adjacent slashes
          if (!uiHeaderRelativePath.empty() &&
              uiHeaderRelativePath.back() != '/') {
            uiHeaderRelativePath += '/';
          }

          auto uiHeaderFilePath = cmStrCat(
            '/', uiHeaderRelativePath, "ui_"_s,
            cmSystemTools::GetFilenameWithoutLastExtension(fullPath), ".h"_s);

          ConfigString uiHeader;
          std::string uiHeaderGenex;
          this->ConfigFileNamesAndGenex(
            uiHeader, uiHeaderGenex, cmStrCat(this->Dir.Build, "/include"_s),
            uiHeaderFilePath);

          this->Uic.UiHeaders.emplace_back(
            std::make_pair(uiHeader, uiHeaderGenex));
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(fullPath);
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->FullPath);
      }
    } else if (this->CMP0071Warn) {
      cm::string_view property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = "SKIP_AUTOGEN";
      } else if (this->Moc.Enabled) {
        property = "SKIP_AUTOMOC";
      } else if (this->Uic.Enabled) {
        property = "SKIP_AUTOUIC";
      }
      std::string files;
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        files += cmStrCat("  ", Quoted(muf->FullPath), '\n');
      }
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0071), '\n',
          "For compatibility, CMake is excluding the GENERATED source "
          "file(s):\n",
          files, "from processing by ",
          cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false),
          ".  If any of the files should be processed, set CMP0071 to NEW.  "
          "If any of the files should not be processed, "
          "explicitly exclude them by setting the source file property ",
          property, ":\n  set_property(SOURCE file.h PROPERTY ", property,
          " ON)\n"));
    }
  }

  // Generate CMP0100 warning
  if (this->MocOrUicEnabled() &&
      !this->AutogenTarget.CMP0100HeadersWarn.empty()) {
    cm::string_view property;
    if (this->Moc.Enabled && this->Uic.Enabled) {
      property = "SKIP_AUTOGEN";
    } else if (this->Moc.Enabled) {
      property = "SKIP_AUTOMOC";
    } else if (this->Uic.Enabled) {
      property = "SKIP_AUTOUIC";
    }
    std::string files;
    for (cmSourceFile* sf : this->AutogenTarget.CMP0100HeadersWarn) {
      files += cmStrCat("  ", Quoted(sf->GetFullPath()), '\n');
    }
    this->Makefile->IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0100), '\n',
        "For compatibility, CMake is excluding the header file(s):\n", files,
        "from processing by ",
        cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false),
        ".  If any of the files should be processed, set CMP0100 to NEW.  "
        "If any of the files should not be processed, "
        "explicitly exclude them by setting the source file property ",
        property, ":\n  set_property(SOURCE file.hh PROPERTY ", property,
        " ON)\n"));
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget =
      cmExpandedList(this->GenTarget->GetSafeProperty(kw.AUTORCC_OPTIONS));

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Path checksum
      qrc.QrcPathChecksum = this->PathCheckSum.getPart(qrc.QrcFile);
      // Output file name
      qrc.OutputFile = cmStrCat(this->Dir.Build, '/', qrc.QrcPathChecksum,
                                "/qrc_", qrc.QrcName, ".cpp");
      std::string const base = cmStrCat(this->Dir.Info, "/AutoRcc_",
                                        qrc.QrcName, '_', qrc.QrcPathChecksum);
      qrc.LockFile = cmStrCat(base, "_Lock.lock");
      qrc.InfoFile = cmStrCat(base, "_Info.json");
      this->ConfigFileNames(qrc.SettingsFile, cmStrCat(base, "_Used"), ".txt");
    }
    // rcc options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += cmStrCat('_', qrc.QrcPathChecksum);
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // rcc resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        RccLister const lister(this->Rcc.Executable,
                               this->Rcc.ExecutableFeatures->ListOptions);
        if (!lister.list(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}